

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::JobManager::GetSelectedCommissioner
          (Error *__return_storage_ptr__,JobManager *this,CommissionerAppPtr *aCommissioner)

{
  string *this_00;
  _Rb_tree_header *p_Var1;
  ErrorCode EVar2;
  Status SVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  uint64_t nid;
  CommissionerAppPtr commissioner;
  Config conf;
  ulong local_190;
  string local_188;
  undefined1 local_160 [8];
  _Alloc_hider local_158;
  char local_148 [16];
  undefined1 local_138 [16];
  element_type *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  format_string_checker<char> *local_118;
  _Alloc_hider local_110;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  SVar3 = persistent_storage::Registry::GetCurrentNetworkXpan
                    ((this->mInterpreter->mRegistry).
                     super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&local_190);
  if (SVar3 != kSuccess) {
    local_138._0_4_ = none_type;
    local_138._8_8_ = "getting selected network failed";
    local_128 = (element_type *)0x1f;
    local_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_110._M_p = (pointer)0x0;
    begin = "getting selected network failed";
    local_118 = (format_string_checker<char> *)local_138;
    do {
      pcVar4 = begin + 1;
      if (*begin == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)local_138);
      }
      begin = pcVar4;
    } while (pcVar4 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_138;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_188,(v10 *)"getting selected network failed",(string_view)ZEXT816(0x1f),args);
    local_160._0_4_ = kRegistryError;
    local_158._M_p = local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    __return_storage_ptr__->mCode = local_160._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_158);
    if (local_158._M_p != local_148) {
      operator_delete(local_158._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p == &local_188.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_188._M_dataplus._M_p);
    return __return_storage_ptr__;
  }
  if (local_190 == 0) {
    (aCommissioner->
    super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (this->mDefaultCommissioner).
         super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    __r = &(this->mDefaultCommissioner).
           super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount;
LAB_00285313:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(aCommissioner->
                super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount,__r);
  }
  else {
    p_Var6 = (this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var6 != (_Base_ptr)0x0) {
      p_Var1 = &(this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = &p_Var1->_M_header;
      do {
        if (*(ulong *)(p_Var6 + 1) >= local_190) {
          p_Var7 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < local_190];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var7 != p_Var1) && (*(ulong *)(p_Var7 + 1) <= local_190)) {
        (aCommissioner->
        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)p_Var7[1]._M_parent;
        __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var7[1]._M_left;
        goto LAB_00285313;
      }
    }
    Config::Config((Config *)local_138,&this->mDefaultConf);
    local_188._M_dataplus._M_p = (pointer)0x0;
    local_188._M_string_length = 0;
    PrepareDtlsConfig((Error *)local_160,this,local_190,(Config *)local_138);
    __return_storage_ptr__->mCode = local_160._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_158);
    EVar2 = __return_storage_ptr__->mCode;
    if (local_158._M_p != local_148) {
      operator_delete(local_158._M_p);
    }
    if (EVar2 == kNone) {
      CommissionerAppCreate
                ((Error *)local_160,(shared_ptr<ot::commissioner::CommissionerApp> *)&local_188,
                 (Config *)local_138);
      __return_storage_ptr__->mCode = local_160._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_158);
      EVar2 = __return_storage_ptr__->mCode;
      if (local_158._M_p != local_148) {
        operator_delete(local_158._M_p);
      }
      if (EVar2 == kNone) {
        pmVar5 = std::
                 map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
                 ::operator[](&this->mCommissionerPool,&local_190);
        (pmVar5->super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr = (element_type *)local_188._M_dataplus._M_p;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pmVar5->
                    super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_188._M_string_length);
        pmVar5 = std::
                 map<unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
                 ::operator[](&this->mCommissionerPool,&local_190);
        (aCommissioner->
        super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (pmVar5->
             super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(aCommissioner->
                    super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount,
                   &(pmVar5->
                    super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._M_string_length);
    }
    Config::~Config((Config *)local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::GetSelectedCommissioner(CommissionerAppPtr &aCommissioner)
{
    Error          error = ERROR_NONE;
    uint64_t       nid;
    RegistryStatus status;

    status = mInterpreter.mRegistry->GetCurrentNetworkXpan(nid);
    VerifyOrExit(RegistryStatus::kSuccess == status, error = ERROR_REGISTRY_ERROR("getting selected network failed"));

    if (nid != 0)
    {
        auto entry = mCommissionerPool.find(nid);
        if (entry != mCommissionerPool.end())
        {
            aCommissioner = entry->second;
        }
        else
        {
            Config             conf         = mDefaultConf;
            CommissionerAppPtr commissioner = nullptr;

            SuccessOrExit(error = PrepareDtlsConfig(nid, conf));
            SuccessOrExit(error = CommissionerAppCreate(commissioner, conf));
            mCommissionerPool[nid] = commissioner;
            aCommissioner          = mCommissionerPool[nid];
        }
    }
    else
    {
        aCommissioner = mDefaultCommissioner;
    }
exit:
    return error;
}